

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

void Fra_BmcFilterImplications(Fra_Man_t *p,Fra_Bmc_t *pBmc)

{
  Vec_Int_t *vImps;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  uint fComplL;
  long lVar8;
  Aig_Obj_t *extraout_RDX;
  int i;
  uint uVar9;
  uint uVar10;
  
  if (p->nFramesAll != 1) {
    __assert_fail("p->nFramesAll == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x80,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  if (p->pManAig != pBmc->pAigFrames) {
    __assert_fail("p->pManAig == pBmc->pAigFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x81,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  lVar8 = 0;
  do {
    vImps = pBmc->vImps;
    if (vImps->nSize <= lVar8) {
      Fra_ImpCompactArray(vImps);
      return;
    }
    uVar4 = vImps->pArray[lVar8];
    if (uVar4 != 0) {
      pObj = Aig_ManObj(pBmc->pAig,uVar4 & 0xffff);
      pObj_00 = Aig_ManObj(pBmc->pAig,(int)uVar4 >> 0x10);
      for (i = pBmc->nPref; i < pBmc->nFramesAll; i = i + 1) {
        pAVar6 = Bmc_ObjFrames(pObj,i);
        pAVar7 = Bmc_ObjFrames(pObj_00,i);
        lVar1 = *(long *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x28);
        uVar2 = *(ulong *)(*(long *)(lVar1 + 0x20) +
                          (long)*(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24) *
                          (long)*(int *)(lVar1 + 0x18) * 8);
        lVar1 = *(long *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x28);
        uVar3 = *(ulong *)(*(long *)(lVar1 + 0x20) +
                          (long)*(int *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x24) *
                          (long)*(int *)(lVar1 + 0x18) * 8);
        uVar9 = ((uint)uVar2 ^ *(uint *)&pObj->field_0x18 >> 3) & 1;
        uVar10 = (uint)pAVar6 & 1;
        fComplL = uVar9 ^ uVar10;
        uVar4 = ((uint)pAVar7 ^ *(uint *)&pObj_00->field_0x18 >> 3 ^ (uint)uVar3) & 1;
        pAVar7 = (Aig_Obj_t *)(uVar2 & 0xfffffffffffffffe);
        pAVar6 = (Aig_Obj_t *)(uVar3 & 0xfffffffffffffffe);
        if (pAVar7 == pAVar6) {
          if ((fComplL != uVar4) && (((*(uint *)&pAVar7->field_0x18 & 7) != 1 || (uVar9 == uVar10)))
             ) {
LAB_004f0fbd:
            Vec_IntWriteEntry(pBmc->vImps,(int)lVar8,(int)pAVar6);
            break;
          }
        }
        else {
          iVar5 = Fra_NodesAreImp(p,pAVar7,pAVar6,fComplL,uVar4);
          pAVar6 = extraout_RDX;
          if (iVar5 != 1) goto LAB_004f0fbd;
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void Fra_BmcFilterImplications( Fra_Man_t * p, Fra_Bmc_t * pBmc )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftT, * pRightT;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, f, Imp, Left, Right;
    int fComplL, fComplR;
    assert( p->nFramesAll == 1 );
    assert( p->pManAig == pBmc->pAigFrames );
    Vec_IntForEachEntry( pBmc->vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        Left  = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        // get the corresponding nodes
        pLeft  = Aig_ManObj( pBmc->pAig, Left );
        pRight = Aig_ManObj( pBmc->pAig, Right );
        // iterate through the timeframes
        for ( f = pBmc->nPref; f < pBmc->nFramesAll; f++ )
        {
            // get timeframe nodes
            pLeftT  = Bmc_ObjFrames( pLeft, f );
            pRightT = Bmc_ObjFrames( pRight, f );
            // get the corresponding FRAIG nodes
            pLeftF  = Fra_ObjFraig( Aig_Regular(pLeftT), 0 );
            pRightF = Fra_ObjFraig( Aig_Regular(pRightT), 0 );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF) ^ Aig_IsComplement(pLeftT);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF) ^ Aig_IsComplement(pRightT);
            // check equality
            if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
            {
                if ( fComplL == fComplR ) // x => x  - always true
                    continue;
                assert( fComplL != fComplR );
                // consider 4 possibilities:
                // NOT(1) => 1    or   0 => 1  - always true
                // 1 => NOT(1)    or   1 => 0  - never true
                // NOT(x) => x    or   x       - not always true
                // x => NOT(x)    or   NOT(x)  - not always true
                if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                    continue;
                // disproved implication
                Vec_IntWriteEntry( pBmc->vImps, i, 0 ); 
                break;
            }
            // check the implication 
            if ( Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR ) != 1 )
            {
                Vec_IntWriteEntry( pBmc->vImps, i, 0 );
                break;
            }
        }
    }
    Fra_ImpCompactArray( pBmc->vImps );
}